

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Issue.cpp
# Opt level: O0

string * __thiscall
jbcoin::to_string_abi_cxx11_(string *__return_storage_ptr__,jbcoin *this,Issue *ac)

{
  bool bVar1;
  Currency *currency;
  Currency *currency_00;
  string local_88;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  jbcoin *local_18;
  Issue *ac_local;
  
  local_18 = this;
  ac_local = (Issue *)__return_storage_ptr__;
  bVar1 = isXRP((AccountID *)(this + 0x14));
  if (bVar1) {
    to_string_abi_cxx11_(__return_storage_ptr__,local_18,currency);
  }
  else {
    to_string_abi_cxx11_(&local_58,local_18 + 0x14,(AccountID *)currency);
    std::operator+(&local_38,&local_58,"/");
    to_string_abi_cxx11_(&local_88,local_18,currency_00);
    std::operator+(__return_storage_ptr__,&local_38,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
to_string (Issue const& ac)
{
    if (isXRP (ac.account))
        return to_string (ac.currency);

    return to_string(ac.account) + "/" + to_string(ac.currency);
}